

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

void __thiscall
density::
conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
::reentrant_put_transaction<void>::commit(reentrant_put_transaction<void> *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  reentrant_put_transaction<void> *this_local;
  
  lock._M_device = (mutex_type *)this;
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/conc_heter_queue.h"
               ,0x4e5);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_18,*(mutex_type **)this);
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)(this + 8));
  *(undefined8 *)this = 0;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());
                std::lock_guard<std::mutex> lock(m_queue->m_mutex);
                m_put_transaction.commit();
                m_queue = nullptr;
            }